

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.cpp
# Opt level: O3

void __thiscall HighsGFkSolve::addNonzero(HighsGFkSolve *this,HighsInt row,HighsInt col,uint val)

{
  int *piVar1;
  iterator __position;
  pointer puVar2;
  iterator iVar3;
  undefined4 in_register_00000014;
  char *__to;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  ulong uVar4;
  int local_38;
  uint local_34;
  HighsInt local_30;
  HighsInt local_2c;
  
  __to = (char *)CONCAT44(in_register_00000014,col);
  piVar1 = (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_34 = val;
  local_30 = col;
  local_2c = row;
  if (piVar1 == (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    __position._M_current =
         (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar2 = (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (__position._M_current ==
        (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->Avalue,__position,
                 &local_34);
      __to = extraout_RDX_00;
    }
    else {
      *__position._M_current = val;
      (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    iVar3._M_current =
         (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar3._M_current ==
        (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->Arow,iVar3,&local_2c);
      __to = extraout_RDX_01;
    }
    else {
      *iVar3._M_current = row;
      (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
    }
    iVar3._M_current =
         (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar3._M_current ==
        (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->Acol,iVar3,&local_30);
      __to = extraout_RDX_02;
    }
    else {
      *iVar3._M_current = col;
      (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
    }
    local_38 = -1;
    iVar3._M_current =
         (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    if (iVar3._M_current ==
        (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(&this->Anext,iVar3,&local_38);
      __to = extraout_RDX_03;
    }
    else {
      *iVar3._M_current = -1;
      (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
    }
    local_38 = -1;
    iVar3._M_current =
         (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    if (iVar3._M_current ==
        (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(&this->Aprev,iVar3,&local_38);
      __to = extraout_RDX_04;
    }
    else {
      *iVar3._M_current = -1;
      (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
    }
    uVar4 = (ulong)((long)__position._M_current - (long)puVar2) >> 2;
    local_38 = -1;
    iVar3._M_current =
         (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(&this->ARleft,iVar3,&local_38);
      __to = extraout_RDX_05;
    }
    else {
      *iVar3._M_current = -1;
      (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
    }
    local_38 = -1;
    iVar3._M_current =
         (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(&this->ARright,iVar3,&local_38)
      ;
      __to = extraout_RDX_06;
    }
    else {
      *iVar3._M_current = -1;
      (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
    }
  }
  else {
    uVar4 = (ulong)*piVar1;
    std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::pop
              (&this->freeslots);
    (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] = val;
    (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4] = row;
    (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4] = col;
    (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4] = -1;
    __to = extraout_RDX;
  }
  link(this,(char *)(uVar4 & 0xffffffff),__to);
  return;
}

Assistant:

void HighsGFkSolve::addNonzero(HighsInt row, HighsInt col, unsigned int val) {
  assert(findNonzero(row, col) == -1);
  HighsInt pos;
  if (freeslots.empty()) {
    pos = Avalue.size();
    Avalue.push_back(val);
    Arow.push_back(row);
    Acol.push_back(col);
    Anext.push_back(-1);
    Aprev.push_back(-1);
    ARleft.push_back(-1);
    ARright.push_back(-1);
  } else {
    pos = freeslots.top();
    freeslots.pop();
    Avalue[pos] = val;
    Arow[pos] = row;
    Acol[pos] = col;
    Aprev[pos] = -1;
  }

  link(pos);
}